

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_pink.c
# Opt level: O0

void InitializePinkNoise(PinkNoise *pink,int numRows)

{
  long pmax;
  int i;
  int numRows_local;
  PinkNoise *pink_local;
  
  pink->pink_Index = 0;
  pink->pink_IndexMask = (1 << ((byte)numRows & 0x1f)) + -1;
  pink->pink_Scalar = 1.0 / (float)(long)((numRows + 1) * 0x800000);
  for (pmax._0_4_ = 0; (int)pmax < numRows; pmax._0_4_ = (int)pmax + 1) {
    pink->pink_Rows[(int)pmax] = 0;
  }
  pink->pink_RunningSum = 0;
  return;
}

Assistant:

void InitializePinkNoise( PinkNoise *pink, int numRows )
{
    int i;
    long pmax;
    pink->pink_Index = 0;
    pink->pink_IndexMask = (1<<numRows) - 1;
    /* Calculate maximum possible signed random value. Extra 1 for white noise always added. */
    pmax = (numRows + 1) * (1<<(PINK_RANDOM_BITS-1));
    pink->pink_Scalar = 1.0f / pmax;
    /* Initialize rows. */
    for( i=0; i<numRows; i++ ) pink->pink_Rows[i] = 0;
    pink->pink_RunningSum = 0;
}